

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

Statement *
slang::ast::BlockStatement::fromSyntax
          (Compilation *comp,BlockStatementSyntax *syntax,ASTContext *sourceCtx,
          StatementContext *stmtCtx,bool addInitializers)

{
  uint uVar1;
  pointer ppSVar2;
  size_type sVar3;
  SyntaxNode *this;
  bool bVar4;
  bool bVar5;
  StatementBlockKind blocKind;
  int iVar6;
  ProceduralBlockSymbol *pPVar7;
  Diagnostic *this_00;
  Statement *pSVar8;
  StatementSyntax *pSVar9;
  undefined4 extraout_var;
  BlockStatement *stmt;
  long lVar10;
  SourceRange SVar11;
  string_view arg;
  Statement *local_b0;
  ASTContext context;
  SmallVector<const_slang::ast::Statement_*,_5UL> buffer;
  
  context.assertionInstance = sourceCtx->assertionInstance;
  context.scope.ptr = (sourceCtx->scope).ptr;
  context.lookupIndex = sourceCtx->lookupIndex;
  context._12_4_ = *(undefined4 *)&sourceCtx->field_0xc;
  context.flags.m_bits = (sourceCtx->flags).m_bits;
  context.instanceOrProc = sourceCtx->instanceOrProc;
  context.firstTempVar = sourceCtx->firstTempVar;
  context.randomizeDetails = sourceCtx->randomizeDetails;
  blocKind = SemanticFacts::getStatementBlockKind(syntax);
  if ((context.flags.m_bits & 0x6000) == 0) {
    if ((blocKind != Sequential) && (bVar4 = ASTContext::inAlwaysCombLatch(&context), bVar4)) {
      pPVar7 = ASTContext::getProceduralBlock(&context);
      if (pPVar7 == (ProceduralBlockSymbol *)0x0) {
        assert::assertFailed
                  ("proc",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Statements.cpp"
                   ,0x29d,
                   "static Statement &slang::ast::BlockStatement::fromSyntax(Compilation &, const BlockStatementSyntax &, const ASTContext &, StatementContext &, bool)"
                  );
      }
      SVar11 = parsing::Token::range(&syntax->begin);
      this_00 = ASTContext::addDiag(&context,(DiagCode)0x170008,SVar11);
      arg = SemanticFacts::getProcedureKindStr(pPVar7->procedureKind);
      Diagnostic::operator<<(this_00,arg);
      goto LAB_002335d1;
    }
  }
  else {
    if (blocKind - JoinAll < 2) {
      SVar11 = parsing::Token::range(&syntax->end);
      ASTContext::addDiag(&context,(DiagCode)0x460008,SVar11);
LAB_002335d1:
      pSVar8 = Statement::badStmt(comp,(Statement *)0x0);
      return pSVar8;
    }
    if (blocKind == JoinNone) {
      context.flags.m_bits = context.flags.m_bits & 0xfffff9fff;
    }
  }
  uVar1 = (stmtCtx->flags).m_bits;
  if (blocKind != Sequential) {
    (stmtCtx->flags).m_bits = uVar1 | 2;
  }
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.data_ =
       (pointer)buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.firstElement;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.len = 0;
  buffer.super_SmallVectorBase<const_slang::ast::Statement_*>.cap = 5;
  if (addInitializers) {
    Statement::bindScopeInitializers
              (&context,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>);
  }
  ppSVar2 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.data_;
  sVar3 = (syntax->items).super_span<slang::syntax::SyntaxNode_*,_18446744073709551615UL>.size_;
  bVar4 = false;
  for (lVar10 = 0; sVar3 << 3 != lVar10; lVar10 = lVar10 + 8) {
    this = *(SyntaxNode **)((long)ppSVar2 + lVar10);
    bVar5 = slang::syntax::StatementSyntax::isKind(this->kind);
    if (bVar5) {
      pSVar9 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
      iVar6 = Statement::bind((int)pSVar9,(sockaddr *)&context,(socklen_t)stmtCtx);
      local_b0 = (Statement *)CONCAT44(extraout_var,iVar6);
      SmallVectorBase<slang::ast::Statement_const*>::emplace_back<slang::ast::Statement_const*>
                ((SmallVectorBase<slang::ast::Statement_const*> *)&buffer,&local_b0);
      bVar4 = (bool)(bVar4 | ((Statement *)CONCAT44(extraout_var,iVar6))->kind == Invalid);
    }
  }
  stmt = createBlockStatement
                   (comp,&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>,
                    (SyntaxNode *)syntax,blocKind);
  if ((char)((uVar1 & 2) >> 1) == '\0' && blocKind != Sequential) {
    (stmtCtx->flags).m_bits = (stmtCtx->flags).m_bits & 0x1d;
  }
  if (bVar4) {
    stmt = (BlockStatement *)Statement::badStmt(comp,&stmt->super_Statement);
  }
  SmallVectorBase<const_slang::ast::Statement_*>::~SmallVectorBase
            (&buffer.super_SmallVectorBase<const_slang::ast::Statement_*>);
  return &stmt->super_Statement;
}

Assistant:

Statement& BlockStatement::fromSyntax(Compilation& comp, const BlockStatementSyntax& syntax,
                                      const ASTContext& sourceCtx, StatementContext& stmtCtx,
                                      bool addInitializers) {
    ASTContext context = sourceCtx;
    auto blockKind = SemanticFacts::getStatementBlockKind(syntax);
    if (context.flags.has(ASTFlags::Function | ASTFlags::Final)) {
        if (blockKind == StatementBlockKind::JoinAll || blockKind == StatementBlockKind::JoinAny) {
            context.addDiag(diag::TimingInFuncNotAllowed, syntax.end.range());
            return badStmt(comp, nullptr);
        }
        else if (blockKind == StatementBlockKind::JoinNone) {
            // The "function body" flag does not propagate through fork-join_none
            // blocks, as all statements are allowed in those.
            context.flags &= ~ASTFlags::Function & ~ASTFlags::Final;
        }
    }
    else if (blockKind != StatementBlockKind::Sequential && context.inAlwaysCombLatch()) {
        auto proc = context.getProceduralBlock();
        ASSERT(proc);
        context.addDiag(diag::ForkJoinAlwaysComb, syntax.begin.range())
            << SemanticFacts::getProcedureKindStr(proc->procedureKind);
        return badStmt(comp, nullptr);
    }

    bool wasInForkJoin = stmtCtx.flags.has(StatementFlags::InForkJoin);
    if (blockKind != StatementBlockKind::Sequential)
        stmtCtx.flags |= StatementFlags::InForkJoin;

    bool anyBad = false;
    SmallVector<const Statement*> buffer;

    if (addInitializers)
        bindScopeInitializers(context, buffer);

    for (auto item : syntax.items) {
        if (StatementSyntax::isKind(item->kind)) {
            auto& stmt = Statement::bind(item->as<StatementSyntax>(), context, stmtCtx,
                                         /* inList */ true);
            buffer.push_back(&stmt);
            anyBad |= stmt.bad();
        }
    }

    auto result = createBlockStatement(comp, buffer, syntax, blockKind);

    if (blockKind != StatementBlockKind::Sequential && !wasInForkJoin)
        stmtCtx.flags &= ~StatementFlags::InForkJoin;

    if (anyBad)
        return badStmt(comp, result);

    return *result;
}